

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_utilities.c
# Opt level: O3

size_t check_file(FILE *fh,size_t buffer_size,char delim,size_t fields,int *widths)

{
  uint uVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  
  __s = (char *)malloc(buffer_size);
  rewind((FILE *)fh);
  pcVar2 = fgets(__s,(int)buffer_size,(FILE *)fh);
  if (pcVar2 == (char *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = 0;
    do {
      sVar5 = sVar5 + 1;
      sVar3 = strlen(__s);
      if (__s[sVar3 - 1] != '\n') {
        pcVar2 = "Line %zu will not fit into a %zu-character buffer.\n";
        fields = buffer_size;
LAB_00102185:
        fprintf(_stderr,pcVar2,sVar5,fields);
        rewind((FILE *)fh);
LAB_00102133:
        free(__s);
        return 0xffffffffffffffff;
      }
      pcVar2 = strchr(__s,0x23);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      sVar3 = strlen(__s);
      if (1 < sVar3) {
        pcVar2 = next_token(__s,delim);
        if (fields != 0) {
          sVar4 = 1;
          do {
            if (pcVar2 == (char *)0x0) {
              fprintf(_stderr,"Line %zu contains less than %zu fields.\n",sVar5,fields);
LAB_00102125:
              rewind((FILE *)fh);
              goto LAB_00102133;
            }
            uVar1 = widths[sVar4 - 1];
            if ((-1 < (long)(int)uVar1) &&
               (sVar3 = strlen(pcVar2), (ulong)(long)(int)uVar1 <= sVar3)) {
              fprintf(_stderr,"Line %zu: Field %zu \'%s\' will not fit in a %d character string.\n",
                      sVar5,sVar4,pcVar2,(ulong)uVar1);
              goto LAB_00102125;
            }
            pcVar2 = next_token((char *)0x0,delim);
            bVar6 = sVar4 != fields;
            sVar4 = sVar4 + 1;
          } while (bVar6);
        }
        if (pcVar2 != (char *)0x0) {
          pcVar2 = "Line %zu contains more than %zu fields.\n";
          goto LAB_00102185;
        }
      }
      pcVar2 = fgets(__s,(int)buffer_size,(FILE *)fh);
    } while (pcVar2 != (char *)0x0);
  }
  rewind((FILE *)fh);
  free(__s);
  return sVar5;
}

Assistant:

size_t check_file( FILE * fh, size_t buffer_size, char delim, size_t fields, int const * widths )
{
    /* Dynamically allocated buffer */
    char * buffer = malloc( buffer_size );
    size_t lines = 0;

    rewind( fh );

    while ( fgets( buffer, buffer_size, fh ) )
    {
        size_t i;
        char * p;

        ++lines;

        /* Check line for complete read */
        if ( buffer[ strlen( buffer ) - 1 ] != '\n' )
        {
            fprintf( stderr, "Line %zu will not fit into a %zu-character buffer.\n", lines, buffer_size );
            rewind( fh );
            free( buffer );
            return -1;
        }

        /* Remove comments */
        if ( ( p = strchr( buffer, '#' ) ) != NULL )
        {
            *p = '\0';
        }

        /* > 1 because of newline */
        if ( strlen( buffer ) > 1 )
        {
            /* Check field count and field widths */
            p = next_token( buffer, delim );

            for ( i = 0; i < fields; ++i )
            {
                if ( ! p )
                {
                    fprintf( stderr, "Line %zu contains less than %zu fields.\n", lines, fields );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                if ( widths[ i ] >= 0 && strlen( p ) >= ( unsigned )widths[ i ] )
                {
                    fprintf( stderr, "Line %zu: Field %zu '%s' will not fit in a %d character string.\n", lines, i + 1, p, widths[ i ] );
                    rewind( fh );
                    free( buffer );
                    return -1;
                }

                p = next_token( NULL, delim );
            }

            if ( p )
            {
                fprintf( stderr, "Line %zu contains more than %zu fields.\n", lines, fields );
                rewind( fh );
                free( buffer );
                return -1;
            }
        }
    }

    /* Rewind, free the buffer, and report the number of lines */
    rewind( fh );
    free( buffer );
    return lines;
}